

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O0

void __thiscall DIS::ActionResponsePdu::~ActionResponsePdu(ActionResponsePdu *this)

{
  ActionResponsePdu *this_local;
  
  (this->super_SimulationManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ActionResponsePdu_00271288;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatums);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::~vector
            (&this->_variableDatums);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::~vector(&this->_fixedDatums);
  SimulationManagementFamilyPdu::~SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  return;
}

Assistant:

ActionResponsePdu::~ActionResponsePdu()
{
    _fixedDatums.clear();
    _variableDatums.clear();
}